

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_server.cpp
# Opt level: O1

void __thiscall cppcms::impl::tcp_cache_service::server::start_accept(server *this)

{
  ulong uVar1;
  size_t sVar2;
  pointer ppiVar3;
  io_service *srv;
  session *this_00;
  shared_ptr<cppcms::impl::tcp_cache_service::session> s;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_58;
  intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_> local_50;
  intrusive_ptr<cppcms::impl::base_cache> local_48;
  shared_ptr<cppcms::sessions::session_storage_factory> local_40;
  long local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  this_00 = (session *)operator_new(0xe0);
  sVar2 = this->counter;
  ppiVar3 = (this->services_).
            super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar1 = sVar2 + 1;
  this->counter = uVar1;
  if ((ulong)((long)(this->services_).
                    super__Vector_base<booster::aio::io_service_*,_std::allocator<booster::aio::io_service_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppiVar3 >> 3) <= uVar1) {
    this->counter = 0;
  }
  srv = ppiVar3[(int)sVar2];
  local_48.p_ = (this->cache_).p_;
  if (local_48.p_ != (base_cache *)0x0) {
    (*(local_48.p_)->_vptr_base_cache[6])();
  }
  local_40.super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (this->sessions_).
            super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_40.super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (this->sessions_).
       super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40.
      super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.
       super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.
       super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.
            super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  tcp_cache_service::session::session(this_00,srv,&local_48,&local_40);
  std::__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<cppcms::impl::tcp_cache_service::session,void>
            ((__shared_ptr<cppcms::impl::tcp_cache_service::session,(__gnu_cxx::_Lock_policy)2> *)
             &local_30,this_00);
  if (local_40.
      super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<cppcms::sessions::session_storage_factory,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  booster::intrusive_ptr<cppcms::impl::base_cache>::~intrusive_ptr(&local_48);
  mfunc_to_event_handler<cppcms::impl::tcp_cache_service::server,cppcms::impl::tcp_cache_service::server*,std::shared_ptr<cppcms::impl::tcp_cache_service::session>,std::shared_ptr<cppcms::impl::tcp_cache_service::session>>
            ((offset_in_server_to_subr)&local_58,(server *)on_accept,
             (shared_ptr<cppcms::impl::tcp_cache_service::session> *)0x0);
  local_50.p_ = local_58.p_;
  if (local_58.p_ != (callable<void_(const_std::error_code_&)> *)0x0) {
    booster::atomic_counter::inc();
  }
  booster::aio::acceptor::async_accept((stream_socket *)this,(callback *)(local_30 + 0x98));
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_50);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::~intrusive_ptr
            (&local_58);
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  return;
}

Assistant:

void start_accept()
	{
		booster::shared_ptr<session> s(new session(get_next_io_service(),cache_,sessions_));
		acceptor_.async_accept(s->socket_,mfunc_to_event_handler(&server::on_accept,this,s));
	}